

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internalJSONNode.cpp
# Opt level: O0

void __thiscall internalJSONNode::Set(internalJSONNode *this,bool val)

{
  json_string *local_38;
  bool val_local;
  internalJSONNode *this_local;
  
  this->_type = '\x03';
  (this->_value)._bool = val;
  if (val) {
    local_38 = jsonSingletonCONST_TRUE::getValue_abi_cxx11_();
  }
  else {
    local_38 = jsonSingletonCONST_FALSE::getValue_abi_cxx11_();
  }
  std::__cxx11::string::operator=((string *)&this->_string,(string *)local_38);
  SetFetched(this,true);
  return;
}

Assistant:

void internalJSONNode::Set(bool val) json_nothrow {
    makeNotContainer();
    _type = JSON_BOOL;
    _value._bool = val;
    #if(defined(JSON_CASTABLE) || !defined(JSON_LESS_MEMORY) || defined(JSON_WRITE_PRIORITY))
	   _string = val ? json_global(CONST_TRUE) : json_global(CONST_FALSE);
    #endif
    SetFetched(true);
}